

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.cc
# Opt level: O2

MatchResult * __thiscall
Regex::match(MatchResult *__return_storage_ptr__,Regex *this,char16_t *string,size_t length,
            MatchData *match_data,uint options)

{
  int iVar1;
  size_t *psVar2;
  
  __return_storage_ptr__->end_offset = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->start_offset = 0;
  iVar1 = pcre2_match_16(this->code,(PCRE2_SPTR16)string,length,0,
                         (options & 3) + (options & 4) * 8 ^ 0x23,match_data->data,
                         (pcre2_match_context_16 *)0x0);
  if (iVar1 < 0) {
    if (iVar1 == -1) {
      __return_storage_ptr__->type = None;
      return __return_storage_ptr__;
    }
    if (iVar1 != -2) {
      __return_storage_ptr__->type = Error;
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->type = Partial;
  }
  else {
    __return_storage_ptr__->type = Full;
  }
  psVar2 = pcre2_get_ovector_pointer_16(match_data->data);
  __return_storage_ptr__->start_offset = *psVar2;
  psVar2 = pcre2_get_ovector_pointer_16(match_data->data);
  __return_storage_ptr__->end_offset = psVar2[1];
  return __return_storage_ptr__;
}

Assistant:

MatchResult Regex::match(const char16_t *string, size_t length,
                         MatchData &match_data, unsigned options) const {
  MatchResult result{MatchResult::None, 0, 0};

  unsigned int pcre_options = 0;
  if (!(options & MatchOptions::IsEndSearch)) pcre_options |= PCRE2_PARTIAL_HARD;
  if (!(options & MatchOptions::IsBeginningOfLine)) pcre_options |= PCRE2_NOTBOL;
  if (!(options & MatchOptions::IsEndOfLine)) pcre_options |= PCRE2_NOTEOL;

  int status = pcre2_match(
    code,
    reinterpret_cast<const uint16_t *>(string),
    length,
    0,
    pcre_options,
    match_data.data,
    nullptr
  );

  if (status < 0) {
    switch (status) {
      case PCRE2_ERROR_PARTIAL:
        result.type = MatchResult::Partial;
        result.start_offset = pcre2_get_ovector_pointer(match_data.data)[0];
        result.end_offset = pcre2_get_ovector_pointer(match_data.data)[1];
        break;
      case PCRE2_ERROR_NOMATCH:
        result.type = MatchResult::None;
        break;
      default:
        result.type = MatchResult::Error;
        break;
    }
  } else {
    result.type = MatchResult::Full;
    result.start_offset = pcre2_get_ovector_pointer(match_data.data)[0];
    result.end_offset = pcre2_get_ovector_pointer(match_data.data)[1];
  }

  return result;
}